

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

JSONNode * JSONNode::newJSONNode(JSONNode *orig)

{
  internalJSONNode *piVar1;
  JSONNode *pJVar2;
  size_t *psVar3;
  
  pJVar2 = (JSONNode *)operator_new(8);
  piVar1 = orig->internal;
  psVar3 = &piVar1->refcount;
  *psVar3 = *psVar3 + 1;
  pJVar2->internal = piVar1;
  psVar3 = getCopyCtorCounter();
  *psVar3 = *psVar3 + 1;
  return pJVar2;
}

Assistant:

JSONNode * JSONNode::newJSONNode(const JSONNode & orig    JSON_MUTEX_COPY_DECL) {
	#ifdef JSON_MUTEX_CALLBACKS
		if (parentMutex != 0){
			JSONNode * temp = _newJSONNode(orig);
			temp -> set_mutex(parentMutex);
			return temp;
		}
	#endif
	return _newJSONNode(orig);
}